

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

void __thiscall rapidxml::xml_node<char>::remove_all_attributes(xml_node<char> *this)

{
  xml_attribute<char> *pxVar1;
  xml_attribute<char> **ppxVar2;
  
  ppxVar2 = &this->m_first_attribute;
  while (pxVar1 = *ppxVar2, pxVar1 != (xml_attribute<char> *)0x0) {
    (pxVar1->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
    ppxVar2 = &pxVar1->m_next_attribute;
  }
  this->m_first_attribute = (xml_attribute<char> *)0x0;
  return;
}

Assistant:

xml_attribute<Ch> *first_attribute(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_attribute<Ch> *attribute = m_first_attribute; attribute; attribute = attribute->m_next_attribute)
                    if (internal::compare(attribute->name(), attribute->name_size(), name, name_size, case_sensitive))
                        return attribute;
                return 0;
            }
            else
                return m_first_attribute;
        }